

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

void ssh_got_ssh_version(ssh_version_receiver *rcv,int major_version)

{
  Ssh *ssh;
  Interactor *pIVar1;
  code *pcVar2;
  BinaryPacketProtocol *bpp;
  Conf *pCVar3;
  ssh_sharing_state *psVar4;
  _Bool _Var5;
  _Bool tryagent;
  _Bool notrivialauth;
  _Bool change_username;
  _Bool try_ki_auth;
  _Bool try_gssapi_auth;
  _Bool try_gssapi_kex_auth;
  _Bool gssapi_fwd;
  int iVar6;
  int iVar7;
  BinaryPacketProtocol *pBVar8;
  char *pcVar9;
  PacketProtocolLayer *pPVar10;
  ssh_gss_liblist *psVar11;
  Filename *keyfile;
  Filename *detached_cert_file;
  char *server_greeting;
  Pinger *pPVar12;
  ulong uVar13;
  _func_void_ssh_version_receiver_ptr_int *p_Var14;
  _func_void_ssh_version_receiver_ptr_int *p_Var15;
  ulong uVar16;
  bool bVar17;
  PacketProtocolLayer *local_90;
  
  *(undefined1 *)&rcv[0x39].got_ssh_version = 1;
  if (*(int *)&rcv[0x17].got_ssh_version != major_version) {
    __assert_fail("ssh->version == major_version",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/ssh.c",0xbf
                  ,"void ssh_got_ssh_version(struct ssh_version_receiver *, int)");
  }
  ssh = (Ssh *)(rcv + -3);
  bpp = (BinaryPacketProtocol *)rcv[0x34].got_ssh_version;
  iVar6 = ssh_verstring_get_bugs(bpp);
  *(int *)&rcv[1].got_ssh_version = iVar6;
  if (*(char *)&rcv[0xb].got_ssh_version == '\0') {
    if (*(int *)&rcv[0x17].got_ssh_version == 2) {
      _Var5 = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0xbf);
      if (_Var5) {
        _Var5 = rcv[0xc].got_ssh_version == (_func_void_ssh_version_receiver_ptr_int *)0x0;
      }
      else {
        _Var5 = false;
      }
      pBVar8 = ssh2_bpp_new((LogContext *)rcv[9].got_ssh_version,(DataTransferStats *)(rcv + 0x30),
                            false);
      rcv[0x34].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)pBVar8;
      pBVar8->ssh = ssh;
      pBVar8->in_raw = (bufchain *)(rcv + 0x1b);
      pBVar8->out_raw = (bufchain *)(rcv + 0x20);
      bufchain_set_callback_inner
                ((bufchain *)(rcv + 0x20),(IdempotentCallback *)(rcv + 0x2b),
                 queue_idempotent_callback);
      p_Var15 = rcv[0x34].got_ssh_version;
      *(ssh_version_receiver **)(p_Var15 + 0x90) = rcv + 0x2e;
      *(_func_void_ssh_version_receiver_ptr_int **)(p_Var15 + 0x98) = rcv[9].got_ssh_version;
      *(undefined4 *)(p_Var15 + 0xd8) = *(undefined4 *)&rcv[1].got_ssh_version;
      if (rcv[0xe].got_ssh_version == (_func_void_ssh_version_receiver_ptr_int *)0x0) {
        psVar11 = ssh_gss_setup((Conf *)rcv[-1].got_ssh_version);
        rcv[0xe].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)psVar11;
      }
      rcv[0xf].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)0x0;
      if (0 < *(int *)(rcv[0xe].got_ssh_version + 8)) {
        iVar6 = 0;
        do {
          iVar7 = conf_get_int_int((Conf *)rcv[-1].got_ssh_version,0x2e,iVar6);
          uVar13 = (ulong)*(int *)(rcv[0xe].got_ssh_version + 8);
          bVar17 = 0 < (long)uVar13;
          if (0 < (long)uVar13) {
            p_Var15 = *(_func_void_ssh_version_receiver_ptr_int **)rcv[0xe].got_ssh_version;
            if (*(int *)p_Var15 != iVar7) {
              uVar16 = 0;
              p_Var14 = p_Var15;
              do {
                if (uVar13 - 1 == uVar16) goto LAB_001161da;
                p_Var15 = p_Var14 + 200;
                uVar16 = uVar16 + 1;
                pcVar2 = p_Var14 + 200;
                p_Var14 = p_Var15;
              } while (*(int *)pcVar2 != iVar7);
              bVar17 = uVar16 < uVar13;
            }
            rcv[0xf].got_ssh_version = p_Var15;
            if (bVar17) break;
          }
LAB_001161da:
          iVar6 = iVar6 + 1;
        } while (iVar6 < 4);
        if (rcv[0xf].got_ssh_version == (_func_void_ssh_version_receiver_ptr_int *)0x0) {
          __assert_fail("ssh->gss_state.lib",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/ssh.c"
                        ,0xf0,"void ssh_got_ssh_version(struct ssh_version_receiver *, int)");
        }
      }
      pCVar3 = (Conf *)rcv[-1].got_ssh_version;
      psVar4 = (ssh_sharing_state *)rcv[0xc].got_ssh_version;
      pcVar9 = ssh_verstring_get_remote(bpp);
      pPVar10 = ssh2_connection_new(ssh,psVar4,_Var5,pCVar3,pcVar9,(bufchain *)(rcv + 0x25),
                                    (ConnectionLayer **)(rcv + 0x36));
      pPVar10->bpp = (BinaryPacketProtocol *)rcv[0x34].got_ssh_version;
      pPVar10->seat = (Seat *)rcv[-2].got_ssh_version;
      pIVar1 = (Interactor *)(rcv + 5);
      pPVar10->interactor = pIVar1;
      pPVar10->ssh = ssh;
      pPVar10->logctx = (LogContext *)rcv[9].got_ssh_version;
      pPVar10->remote_bugs = *(uint *)&rcv[1].got_ssh_version;
      _Var5 = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x25);
      if (_Var5) {
        local_90 = (PacketProtocolLayer *)0x0;
      }
      else {
        pcVar9 = get_remote_username((Conf *)rcv[-1].got_ssh_version);
        p_Var15 = rcv[0x12].got_ssh_version;
        p_Var14 = rcv[0x14].got_ssh_version;
        keyfile = conf_get_filename((Conf *)rcv[-1].got_ssh_version,0x21);
        detached_cert_file = conf_get_filename((Conf *)rcv[-1].got_ssh_version,0x22);
        _Var5 = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x27);
        tryagent = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x1d);
        notrivialauth = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x26);
        change_username = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x1f);
        try_ki_auth = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x29);
        try_gssapi_auth = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x2a);
        try_gssapi_kex_auth = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x2b);
        gssapi_fwd = conf_get_bool((Conf *)rcv[-1].got_ssh_version,0x2c);
        pPVar10 = ssh2_userauth_new(pPVar10,(char *)p_Var15,(char *)p_Var14,keyfile,
                                    detached_cert_file,_Var5,tryagent,notrivialauth,pcVar9,
                                    change_username,try_ki_auth,try_gssapi_auth,try_gssapi_kex_auth,
                                    gssapi_fwd,(ssh_connection_shared_gss_state *)(rcv + 0xe));
        pPVar10->bpp = (BinaryPacketProtocol *)rcv[0x34].got_ssh_version;
        pPVar10->seat = (Seat *)rcv[-2].got_ssh_version;
        pPVar10->interactor = pIVar1;
        pPVar10->ssh = ssh;
        pPVar10->logctx = (LogContext *)rcv[9].got_ssh_version;
        pPVar10->remote_bugs = *(uint *)&rcv[1].got_ssh_version;
        safefree(pcVar9);
        local_90 = pPVar10;
      }
      pCVar3 = (Conf *)rcv[-1].got_ssh_version;
      p_Var15 = rcv[0x12].got_ssh_version;
      iVar6 = *(int *)&rcv[0x13].got_ssh_version;
      p_Var14 = rcv[0x14].got_ssh_version;
      pcVar9 = ssh_verstring_get_local(bpp);
      server_greeting = ssh_verstring_get_remote(bpp);
      pPVar10 = ssh2_transport_new(pCVar3,(char *)p_Var15,iVar6,(char *)p_Var14,pcVar9,
                                   server_greeting,(ssh_connection_shared_gss_state *)(rcv + 0xe),
                                   (DataTransferStats *)(rcv + 0x30),pPVar10,(SshServerConfig *)0x0)
      ;
      rcv[0x35].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)pPVar10;
      pPVar10->bpp = (BinaryPacketProtocol *)rcv[0x34].got_ssh_version;
      pPVar10->seat = (Seat *)rcv[-2].got_ssh_version;
      pPVar10->interactor = pIVar1;
      pPVar10->ssh = ssh;
      pPVar10->logctx = (LogContext *)rcv[9].got_ssh_version;
      pPVar10->remote_bugs = *(uint *)&rcv[1].got_ssh_version;
      if (local_90 != (PacketProtocolLayer *)0x0) {
        ssh2_userauth_set_transport_layer(local_90,pPVar10);
      }
    }
    else {
      pBVar8 = ssh1_bpp_new((LogContext *)rcv[9].got_ssh_version);
      rcv[0x34].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)pBVar8;
      pBVar8->ssh = ssh;
      pBVar8->in_raw = (bufchain *)(rcv + 0x1b);
      pBVar8->out_raw = (bufchain *)(rcv + 0x20);
      bufchain_set_callback_inner
                ((bufchain *)(rcv + 0x20),(IdempotentCallback *)(rcv + 0x2b),
                 queue_idempotent_callback);
      p_Var15 = rcv[0x34].got_ssh_version;
      *(ssh_version_receiver **)(p_Var15 + 0x90) = rcv + 0x2e;
      *(_func_void_ssh_version_receiver_ptr_int **)(p_Var15 + 0x98) = rcv[9].got_ssh_version;
      *(undefined4 *)(p_Var15 + 0xd8) = *(undefined4 *)&rcv[1].got_ssh_version;
      pPVar10 = ssh1_connection_new(ssh,(Conf *)rcv[-1].got_ssh_version,(bufchain *)(rcv + 0x25),
                                    (ConnectionLayer **)(rcv + 0x36));
      pPVar10->bpp = (BinaryPacketProtocol *)rcv[0x34].got_ssh_version;
      pPVar10->seat = (Seat *)rcv[-2].got_ssh_version;
      pPVar10->interactor = (Interactor *)(rcv + 5);
      pPVar10->ssh = ssh;
      pPVar10->logctx = (LogContext *)rcv[9].got_ssh_version;
      pPVar10->remote_bugs = *(uint *)&rcv[1].got_ssh_version;
      pPVar10 = ssh1_login_new((Conf *)rcv[-1].got_ssh_version,(char *)rcv[0x12].got_ssh_version,
                               *(int *)&rcv[0x13].got_ssh_version,pPVar10);
      rcv[0x35].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)pPVar10;
      pPVar10->bpp = (BinaryPacketProtocol *)rcv[0x34].got_ssh_version;
      pPVar10->seat = (Seat *)rcv[-2].got_ssh_version;
      pPVar10->interactor = (Interactor *)(rcv + 5);
      pPVar10->ssh = ssh;
      pPVar10->logctx = (LogContext *)rcv[9].got_ssh_version;
      pPVar10->remote_bugs = *(uint *)&rcv[1].got_ssh_version;
    }
  }
  else {
    pBVar8 = ssh2_bare_bpp_new((LogContext *)rcv[9].got_ssh_version);
    rcv[0x34].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)pBVar8;
    pBVar8->ssh = ssh;
    pBVar8->in_raw = (bufchain *)(rcv + 0x1b);
    pBVar8->out_raw = (bufchain *)(rcv + 0x20);
    bufchain_set_callback_inner
              ((bufchain *)(rcv + 0x20),(IdempotentCallback *)(rcv + 0x2b),queue_idempotent_callback
              );
    p_Var15 = rcv[0x34].got_ssh_version;
    *(ssh_version_receiver **)(p_Var15 + 0x90) = rcv + 0x2e;
    *(_func_void_ssh_version_receiver_ptr_int **)(p_Var15 + 0x98) = rcv[9].got_ssh_version;
    *(undefined4 *)(p_Var15 + 0xd8) = *(undefined4 *)&rcv[1].got_ssh_version;
    pCVar3 = (Conf *)rcv[-1].got_ssh_version;
    psVar4 = (ssh_sharing_state *)rcv[0xc].got_ssh_version;
    pcVar9 = ssh_verstring_get_remote(bpp);
    pPVar10 = ssh2_connection_new(ssh,psVar4,false,pCVar3,pcVar9,(bufchain *)(rcv + 0x25),
                                  (ConnectionLayer **)(rcv + 0x36));
    pPVar10->bpp = (BinaryPacketProtocol *)rcv[0x34].got_ssh_version;
    pPVar10->seat = (Seat *)rcv[-2].got_ssh_version;
    pPVar10->interactor = (Interactor *)(rcv + 5);
    pPVar10->ssh = ssh;
    pPVar10->logctx = (LogContext *)rcv[9].got_ssh_version;
    pPVar10->remote_bugs = *(uint *)&rcv[1].got_ssh_version;
    rcv[0x35].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)pPVar10;
  }
  pPVar10 = (PacketProtocolLayer *)rcv[0x35].got_ssh_version;
  pPVar10->selfptr = (PacketProtocolLayer **)(rcv + 0x35);
  ssh_ppl_setup_queues
            (pPVar10,(PktInQueue *)(rcv[0x34].got_ssh_version + 0x20),
             (PktOutQueue *)(rcv[0x34].got_ssh_version + 0x58));
  (**(code **)(*(long *)rcv[-2].got_ssh_version + 0x48))();
  pPVar12 = pinger_new((Conf *)rcv[-1].got_ssh_version,(Backend *)(rcv + 3));
  rcv[0x3a].got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)pPVar12;
  queue_idempotent_callback((IdempotentCallback *)(rcv[0x34].got_ssh_version + 0xa8));
  (**(code **)(*(long *)rcv[0x35].got_ssh_version + 8))();
  (**(code **)(*(long *)(rcv[0x36].got_ssh_version + 8) + 0x78))
            (rcv[0x36].got_ssh_version,*(undefined4 *)((long)&rcv[0x19].got_ssh_version + 4),
             *(undefined4 *)&rcv[0x1a].got_ssh_version);
  ssh_bpp_free(bpp);
  return;
}

Assistant:

static void ssh_got_ssh_version(struct ssh_version_receiver *rcv,
                                int major_version)
{
    Ssh *ssh = container_of(rcv, Ssh, version_receiver);
    BinaryPacketProtocol *old_bpp;
    PacketProtocolLayer *connection_layer;

    ssh->session_started = true;

    /*
     * We don't support choosing a major protocol version dynamically,
     * so this should always be the same value we set up in
     * connect_to_host().
     */
    assert(ssh->version == major_version);

    old_bpp = ssh->bpp;
    ssh->remote_bugs = ssh_verstring_get_bugs(old_bpp);

    if (!ssh->bare_connection) {
        if (ssh->version == 2) {
            PacketProtocolLayer *userauth_layer, *transport_child_layer;

            /*
             * We use the 'simple' variant of the SSH protocol if
             * we're asked to, except not if we're also doing
             * connection-sharing (either tunnelling our packets over
             * an upstream or expecting to be tunnelled over
             * ourselves), since then the assumption that we have only
             * one channel to worry about is not true after all.
             */
            bool is_simple =
                (conf_get_bool(ssh->conf, CONF_ssh_simple) && !ssh->connshare);

            ssh->bpp = ssh2_bpp_new(ssh->logctx, &ssh->stats, false);
            ssh_connect_bpp(ssh);

#ifndef NO_GSSAPI
            /* Load and pick the highest GSS library on the preference
             * list. */
            if (!ssh->gss_state.libs)
                ssh->gss_state.libs = ssh_gss_setup(ssh->conf);
            ssh->gss_state.lib = NULL;
            if (ssh->gss_state.libs->nlibraries > 0) {
                int i, j;
                for (i = 0; i < ngsslibs; i++) {
                    int want_id = conf_get_int_int(ssh->conf,
                                                   CONF_ssh_gsslist, i);
                    for (j = 0; j < ssh->gss_state.libs->nlibraries; j++)
                        if (ssh->gss_state.libs->libraries[j].id == want_id) {
                            ssh->gss_state.lib =
                                &ssh->gss_state.libs->libraries[j];
                            goto got_gsslib;   /* double break */
                        }
                }
              got_gsslib:
                /*
                 * We always expect to have found something in
                 * the above loop: we only came here if there
                 * was at least one viable GSS library, and the
                 * preference list should always mention
                 * everything and only change the order.
                 */
                assert(ssh->gss_state.lib);
            }
#endif

            connection_layer = ssh2_connection_new(
                ssh, ssh->connshare, is_simple, ssh->conf,
                ssh_verstring_get_remote(old_bpp), &ssh->user_input, &ssh->cl);
            ssh_connect_ppl(ssh, connection_layer);

            if (conf_get_bool(ssh->conf, CONF_ssh_no_userauth)) {
                userauth_layer = NULL;
                transport_child_layer = connection_layer;
            } else {
                char *username = get_remote_username(ssh->conf);

                userauth_layer = ssh2_userauth_new(
                    connection_layer, ssh->savedhost, ssh->fullhostname,
                    conf_get_filename(ssh->conf, CONF_keyfile),
                    conf_get_filename(ssh->conf, CONF_detached_cert),
                    conf_get_bool(ssh->conf, CONF_ssh_show_banner),
                    conf_get_bool(ssh->conf, CONF_tryagent),
                    conf_get_bool(ssh->conf, CONF_ssh_no_trivial_userauth),
                    username,
                    conf_get_bool(ssh->conf, CONF_change_username),
                    conf_get_bool(ssh->conf, CONF_try_ki_auth),
#ifndef NO_GSSAPI
                    conf_get_bool(ssh->conf, CONF_try_gssapi_auth),
                    conf_get_bool(ssh->conf, CONF_try_gssapi_kex),
                    conf_get_bool(ssh->conf, CONF_gssapifwd),
                    &ssh->gss_state
#else
                    false,
                    false,
                    false,
                    NULL
#endif
                    );
                ssh_connect_ppl(ssh, userauth_layer);
                transport_child_layer = userauth_layer;

                sfree(username);
            }

            ssh->base_layer = ssh2_transport_new(
                ssh->conf, ssh->savedhost, ssh->savedport,
                ssh->fullhostname,
                ssh_verstring_get_local(old_bpp),
                ssh_verstring_get_remote(old_bpp),
#ifndef NO_GSSAPI
                &ssh->gss_state,
#else
                NULL,
#endif
                &ssh->stats, transport_child_layer, NULL);
            ssh_connect_ppl(ssh, ssh->base_layer);

            if (userauth_layer)
                ssh2_userauth_set_transport_layer(userauth_layer,
                                                  ssh->base_layer);

        } else {

            ssh->bpp = ssh1_bpp_new(ssh->logctx);
            ssh_connect_bpp(ssh);

            connection_layer = ssh1_connection_new(
                ssh, ssh->conf, &ssh->user_input, &ssh->cl);
            ssh_connect_ppl(ssh, connection_layer);

            ssh->base_layer = ssh1_login_new(
                ssh->conf, ssh->savedhost, ssh->savedport, connection_layer);
            ssh_connect_ppl(ssh, ssh->base_layer);

        }

    } else {
        ssh->bpp = ssh2_bare_bpp_new(ssh->logctx);
        ssh_connect_bpp(ssh);

        connection_layer = ssh2_connection_new(
            ssh, ssh->connshare, false, ssh->conf,
            ssh_verstring_get_remote(old_bpp), &ssh->user_input, &ssh->cl);
        ssh_connect_ppl(ssh, connection_layer);
        ssh->base_layer = connection_layer;
    }

    /* Connect the base layer - whichever it is - to the BPP, and set
     * up its selfptr. */
    ssh->base_layer->selfptr = &ssh->base_layer;
    ssh_ppl_setup_queues(ssh->base_layer, &ssh->bpp->in_pq, &ssh->bpp->out_pq);

    seat_update_specials_menu(ssh->seat);
    ssh->pinger = pinger_new(ssh->conf, &ssh->backend);

    queue_idempotent_callback(&ssh->bpp->ic_in_raw);
    ssh_ppl_process_queue(ssh->base_layer);

    /* Pass in the initial terminal size, if we knew it already. */
    ssh_terminal_size(ssh->cl, ssh->term_width, ssh->term_height);

    ssh_bpp_free(old_bpp);
}